

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_biquad_config *
ma_biquad_config_init
          (ma_format format,ma_uint32 channels,double b0,double b1,double b2,double a0,double a1,
          double a2)

{
  ma_uint32 in_EDX;
  ma_format in_ESI;
  ma_biquad_config *in_RDI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  double in_XMM4_Qa;
  double in_XMM5_Qa;
  
  if (in_RDI != (ma_biquad_config *)0x0) {
    memset(in_RDI,0,0x38);
  }
  in_RDI->format = in_ESI;
  in_RDI->channels = in_EDX;
  in_RDI->b0 = in_XMM0_Qa;
  in_RDI->b1 = in_XMM1_Qa;
  in_RDI->b2 = in_XMM2_Qa;
  in_RDI->a0 = in_XMM3_Qa;
  in_RDI->a1 = in_XMM4_Qa;
  in_RDI->a2 = in_XMM5_Qa;
  return in_RDI;
}

Assistant:

MA_API ma_biquad_config ma_biquad_config_init(ma_format format, ma_uint32 channels, double b0, double b1, double b2, double a0, double a1, double a2)
{
    ma_biquad_config config;

    MA_ZERO_OBJECT(&config);
    config.format = format;
    config.channels = channels;
    config.b0 = b0;
    config.b1 = b1;
    config.b2 = b2;
    config.a0 = a0;
    config.a1 = a1;
    config.a2 = a2;

    return config;
}